

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O3

void __thiscall tst_RoleMaskProxyModel::testUseRoleMask(tst_RoleMaskProxyModel *this)

{
  bool userRoleEditable;
  QAbstractItemModel *baseModel;
  bool bVar1;
  char cVar2;
  __atomic_base<int> _Var3;
  undefined8 *puVar4;
  long *plVar5;
  undefined8 uVar6;
  QAbstractItemModelTester *this_00;
  iterator iVar7;
  iterator iVar8;
  QModelIndexList magicNumerIndexes;
  RoleMaskProxyModel proxyModel;
  QVariant local_68;
  anon_union_24_3_e3d07ef4_for_data local_48;
  
  local_68.d.data.shared =
       (PrivateShared *)&QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType;
  _Var3._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId._q_value.
               super___atomic_base<int>._M_i;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var3._M_i = QMetaType::idHelper();
  }
  puVar4 = (undefined8 *)QTest::qData("baseModel",_Var3._M_i);
  baseModel = (QAbstractItemModel *)*puVar4;
  if (baseModel != (QAbstractItemModel *)0x0) {
    local_68.d.data.shared =
         (PrivateShared *)&QtPrivate::QMetaTypeInterfaceWrapper<QList<QModelIndex>_>::metaType;
    _Var3._M_i = (__int_type)
                 QtPrivate::QMetaTypeInterfaceWrapper<QList<QModelIndex>_>::metaType.typeId;
    if ((__atomic_base<int>)
        QtPrivate::QMetaTypeInterfaceWrapper<QList<QModelIndex>_>::metaType.typeId._q_value.
        super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
      _Var3._M_i = QMetaType::idHelper();
    }
    plVar5 = (long *)QTest::qData("magicNumerIndexes",_Var3._M_i);
    magicNumerIndexes.d.d = (Data *)*plVar5;
    magicNumerIndexes.d.ptr = (QModelIndex *)plVar5[1];
    magicNumerIndexes.d.size = plVar5[2];
    if (magicNumerIndexes.d.d != (Data *)0x0) {
      LOCK();
      ((magicNumerIndexes.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((magicNumerIndexes.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    uVar6 = QTest::qData("userRoleEditable",1);
    userRoleEditable = *(bool *)uVar6;
    RoleMaskProxyModel::RoleMaskProxyModel(&proxyModel,(QObject *)0x0);
    this_00 = (QAbstractItemModelTester *)operator_new(0x10);
    QAbstractItemModelTester::QAbstractItemModelTester
              (this_00,(QAbstractItemModel *)&proxyModel,QtTest,(QObject *)baseModel);
    *(undefined ***)this_00 = &PTR_metaObject_001339b0;
    RoleMaskProxyModel::addMaskedRole((int)&proxyModel);
    RoleMaskProxyModel::setSourceModel((QAbstractItemModel *)&proxyModel);
    iVar7 = QList<QModelIndex>::begin(&magicNumerIndexes);
    iVar8 = QList<QModelIndex>::end(&magicNumerIndexes);
    if (iVar7.i != iVar8.i) {
      do {
        QIdentityProxyModel::mapFromSource((QModelIndex *)&local_48);
        QVariant::QVariant(&local_68,0xbfdd2);
        bVar1 = (bool)RoleMaskProxyModel::setData
                                ((QModelIndex *)&proxyModel,(QVariant *)&local_48,(int)&local_68);
        cVar2 = QTest::qVerify(bVar1,
                               "proxyModel.setData(proxyModel.mapFromSource(singleIdx), magicNumber, Qt::UserRole)"
                               ,"",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                               ,0x89);
        QVariant::~QVariant(&local_68);
        if (cVar2 == '\0') goto LAB_0010ad7c;
        QVariant::QVariant(&local_68,-0xbfdd3);
        cVar2 = (**(code **)(*(long *)baseModel + 0x98))(baseModel,iVar7.i,&local_68,0x100);
        cVar2 = QTest::qVerify(userRoleEditable == (bool)cVar2,
                               "userRoleEditable == baseModel->setData(singleIdx, ~magicNumber, Qt::UserRole)"
                               ,"",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                               ,0x8a);
        QVariant::~QVariant(&local_68);
        if (cVar2 == '\0') goto LAB_0010ad7c;
        iVar7.i = iVar7.i + 1;
      } while (iVar7.i != iVar8.i);
    }
    local_68.d.data._forAlignment = -NAN;
    local_68.d.data._8_8_ = 0;
    local_68.d.data._16_8_ = 0;
    local_48._forAlignment = -NAN;
    local_48._8_8_ = 0;
    local_48._16_8_ = 0;
    testUseRoleMaskRecurse
              (this,0xbfdd2,baseModel,&proxyModel,&magicNumerIndexes,userRoleEditable,
               (QModelIndex *)&local_68,(QModelIndex *)&local_48);
    QObject::deleteLater();
LAB_0010ad7c:
    RoleMaskProxyModel::~RoleMaskProxyModel(&proxyModel);
    if (magicNumerIndexes.d.d != (Data *)0x0) {
      LOCK();
      ((magicNumerIndexes.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((magicNumerIndexes.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((magicNumerIndexes.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(magicNumerIndexes.d.d)->super_QArrayData,0x18,8);
      }
    }
  }
  return;
}

Assistant:

void tst_RoleMaskProxyModel::testUseRoleMask()
{
    QFETCH(QAbstractItemModel *, baseModel);
    if (!baseModel)
        return;
    QFETCH(QModelIndexList, magicNumerIndexes);
    QFETCH(bool, userRoleEditable);
    RoleMaskProxyModel proxyModel;
    new ModelTest(&proxyModel, baseModel);
    proxyModel.addMaskedRole(Qt::UserRole);
    proxyModel.setSourceModel(baseModel);
    const int magicNumber = 785874;
    for (const QModelIndex &singleIdx : magicNumerIndexes) {
        QVERIFY(proxyModel.setData(proxyModel.mapFromSource(singleIdx), magicNumber, Qt::UserRole));
        QVERIFY(userRoleEditable == baseModel->setData(singleIdx, ~magicNumber, Qt::UserRole));
    }
    testUseRoleMaskRecurse(magicNumber, baseModel, &proxyModel, magicNumerIndexes, userRoleEditable);
    baseModel->deleteLater();
}